

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceField.cpp
# Opt level: O0

AtomType * __thiscall OpenMD::ForceField::getAtomType(ForceField *this,int ident)

{
  pointer ppVar1;
  AtomType *pAVar2;
  string at;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff98;
  string local_30 [8];
  string *in_stack_ffffffffffffffd8;
  ForceField *in_stack_ffffffffffffffe0;
  
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::find(in_stack_ffffffffffffff98,(key_type *)0x1cba18);
  ppVar1 = std::
           _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)0x1cba27);
  std::__cxx11::string::string(local_30,(string *)&ppVar1->second);
  pAVar2 = getAtomType(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::__cxx11::string::~string(local_30);
  return pAVar2;
}

Assistant:

AtomType* ForceField::getAtomType(int ident) {
    std::string at = atypeIdentToName.find(ident)->second;
    return getAtomType(at);
  }